

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O0

int siftBackwardProb(DdManager *table,Move *moves,int size,double temp)

{
  double dVar1;
  double dVar2;
  double threshold;
  double coin;
  int best_size;
  int res;
  Move *move;
  double temp_local;
  int size_local;
  Move *moves_local;
  DdManager *table_local;
  
  coin._0_4_ = size;
  for (_best_size = moves; _best_size != (Move *)0x0; _best_size = _best_size->next) {
    if (_best_size->size < coin._0_4_) {
      coin._0_4_ = _best_size->size;
    }
  }
  if (coin._0_4_ == size) {
    dVar1 = random_generator();
    dVar2 = exp(-(double)((table->keys - table->isolated) - size) / temp);
    if (dVar1 < dVar2) {
      return 1;
    }
  }
  coin._4_4_ = table->keys - table->isolated;
  _best_size = moves;
  while( true ) {
    if (_best_size == (Move *)0x0) {
      return 1;
    }
    if (coin._4_4_ == coin._0_4_) break;
    coin._4_4_ = cuddSwapInPlace(table,_best_size->x,_best_size->y);
    if (coin._4_4_ == 0) {
      return 0;
    }
    _best_size = _best_size->next;
  }
  return 1;
}

Assistant:

static int
siftBackwardProb(
  DdManager * table,
  Move * moves,
  int  size,
  double  temp)
{
    Move   *move;
    int    res;
    int    best_size = size;
    double coin, threshold;

    /* Look for best size during the last sifting */
    for (move = moves; move != NULL; move = move->next) {
        if (move->size < best_size) {
            best_size = move->size;
        }
    }
    
    /* If best_size equals size, the last sifting did not produce any
    ** improvement. We now toss a coin to decide whether to retain
    ** this change or not.
    */
    if (best_size == size) {
        coin = random_generator();
#ifdef DD_STATS
        tosses++;
#endif
        threshold = exp(-((double)(table->keys - table->isolated - size))/temp);
        if (coin < threshold) {
#ifdef DD_STATS
            acceptances++;
#endif
            return(1);
        }
    }

    /* Either there was improvement, or we have decided not to
    ** accept the uphill move. Go to best position.
    */
    res = table->keys - table->isolated;
    for (move = moves; move != NULL; move = move->next) {
        if (res == best_size) return(1);
        res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
        if (!res) return(0);
    }

    return(1);

}